

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

Binds * __thiscall
jsonnet::internal::Desugarer::singleBind
          (Binds *__return_storage_ptr__,Desugarer *this,Identifier *id,AST *body)

{
  initializer_list<jsonnet::internal::Local::Bind> __l;
  allocator_type local_c1;
  Bind local_c0;
  
  bind((Desugarer *)&local_c0,(int)this,(sockaddr *)id,(socklen_t)body);
  __l._M_len = 1;
  __l._M_array = &local_c0;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  vector(__return_storage_ptr__,__l,&local_c1);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&local_c0.closeFodder);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&local_c0.parenRightFodder);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            (&local_c0.params);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&local_c0.parenLeftFodder);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&local_c0.opFodder);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&local_c0.varFodder);
  return __return_storage_ptr__;
}

Assistant:

Local::Binds singleBind(const Identifier *id, AST *body)
    {
        return {bind(id, body)};
    }